

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall json::Value::stringify(Value *this,ostream *os,bool pretty)

{
  String *this_00;
  bool bVar1;
  bool bVar2;
  IString *pIVar3;
  ArrayStorage *this_01;
  __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *this_03;
  char *in_RCX;
  string_view str;
  string_view str_00;
  Ref *item;
  iterator __end3;
  iterator __begin3;
  ArrayStorage *__range3;
  string local_208 [7];
  bool first;
  undefined1 local_1e8 [16];
  ostream *local_1c8;
  char *pcStack_1c0;
  undefined1 local_1a9;
  stringstream local_1a8 [7];
  bool valid;
  stringstream wtf16;
  String local_198 [383];
  byte local_19;
  ostream *poStack_18;
  bool pretty_local;
  ostream *os_local;
  Value *this_local;
  
  local_19 = pretty;
  poStack_18 = os;
  os_local = (ostream *)this;
  bVar1 = isString(this);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    pIVar3 = getIString(this);
    local_1c8 = (ostream *)(pIVar3->str)._M_len;
    pcStack_1c0 = (pIVar3->str)._M_str;
    str._M_str = in_RCX;
    str._M_len = (size_t)pcStack_1c0;
    local_1a9 = ::wasm::String::convertWTF8ToWTF16(local_198,local_1c8,str);
    this_00 = (String *)poStack_18;
    if (!(bool)local_1a9) {
      __assert_fail("valid",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.cpp"
                    ,0x1b,"void json::Value::stringify(std::ostream &, bool)");
    }
    std::__cxx11::stringstream::str();
    local_1e8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_208);
    str_00._M_len = local_1e8._8_8_;
    str_00._M_str = in_RCX;
    ::wasm::String::printEscapedJSON(this_00,local_1e8._0_8_,str_00);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  else {
    bVar1 = isArray(this);
    if (!bVar1) {
      ::wasm::handle_unreachable
                ("TODO: stringify all of JSON",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.cpp"
                 ,0x2c);
    }
    std::operator<<(poStack_18,'[');
    bVar1 = true;
    this_01 = getArray(this);
    __end3 = std::vector<json::Value::Ref,_std::allocator<json::Value::Ref>_>::begin(this_01);
    item = (Ref *)std::vector<json::Value::Ref,_std::allocator<json::Value::Ref>_>::end(this_01);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<json::Value::Ref_*,_std::vector<json::Value::Ref,_std::allocator<json::Value::Ref>_>_>
                                  *)&item);
      if (!bVar2) break;
      this_02 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<json::Value::Ref_*,_std::vector<json::Value::Ref,_std::allocator<json::Value::Ref>_>_>
                ::operator*(&__end3);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        std::operator<<(poStack_18,',');
      }
      this_03 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_02);
      stringify(this_03,poStack_18,(bool)(local_19 & 1));
      __gnu_cxx::
      __normal_iterator<json::Value::Ref_*,_std::vector<json::Value::Ref,_std::allocator<json::Value::Ref>_>_>
      ::operator++(&__end3);
    }
    std::operator<<(poStack_18,']');
  }
  return;
}

Assistant:

void Value::stringify(std::ostream& os, bool pretty) {
  if (isString()) {
    std::stringstream wtf16;
    [[maybe_unused]] bool valid =
      wasm::String::convertWTF8ToWTF16(wtf16, getIString().str);
    assert(valid);
    // TODO: Use wtf16.view() once we have C++20.
    wasm::String::printEscapedJSON(os, wtf16.str());
  } else if (isArray()) {
    os << '[';
    auto first = true;
    for (auto& item : getArray()) {
      if (first) {
        first = false;
      } else {
        // TODO pretty whitespace
        os << ',';
      }
      item->stringify(os, pretty);
    }
    os << ']';
  } else {
    WASM_UNREACHABLE("TODO: stringify all of JSON");
  }
}